

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O2

void __thiscall
amrex::IArrayBox::IArrayBox(IArrayBox *this,Box *b,int n,bool alloc,bool shared,Arena *ar)

{
  undefined3 in_register_00000009;
  int local_14;
  
  BaseFab<int>::BaseFab(&this->super_BaseFab<int>,b,n,alloc,shared,ar);
  (this->super_BaseFab<int>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_006d9fc8;
  if ((CONCAT31(in_register_00000009,alloc) != 0) && (do_initval == '\x01')) {
    BaseFab<int>::setVal<(amrex::RunOn)1>(&this->super_BaseFab<int>,&local_14);
  }
  return;
}

Assistant:

IArrayBox::IArrayBox (const Box& b, int n, bool alloc, bool shared, Arena* ar)
    : BaseFab<int>(b,n,alloc,shared,ar)
{
#ifndef AMREX_USE_GPU
    // For debugging purposes
    if ( alloc && do_initval ) {
        setVal<RunOn::Host>(std::numeric_limits<int>::max());
    }
#endif
}